

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QToolBarAreaLayoutItem> * __thiscall
QList<QToolBarAreaLayoutItem>::mid
          (QList<QToolBarAreaLayoutItem> *__return_storage_ptr__,QList<QToolBarAreaLayoutItem> *this
          ,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  QToolBarAreaLayoutItem *b;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_60;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_48;
  qsizetype l;
  qsizetype p;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  l = len;
  p = pos;
  CVar1 = QtPrivate::QContainerImplHelper::mid((this->d).size,&p,&l);
  if (CVar1 < Full) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QToolBarAreaLayoutItem *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (CVar1 == Full) {
    QArrayDataPointer<QToolBarAreaLayoutItem>::QArrayDataPointer
              (&__return_storage_ptr__->d,&this->d);
  }
  else {
    local_48._0_16_ = QTypedArrayData<QToolBarAreaLayoutItem>::allocate(l,KeepSize);
    local_48.size = 0;
    b = (this->d).ptr + p;
    QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend
              ((QPodArrayOps<QToolBarAreaLayoutItem> *)&local_48,b,b + l);
    local_60.size = local_48.size;
    local_60.d = local_48.d;
    local_60.ptr = local_48.ptr;
    local_48._0_16_ = ZEXT816(0);
    local_48.size = 0;
    (__return_storage_ptr__->d).d = local_60.d;
    (__return_storage_ptr__->d).ptr = local_60.ptr;
    (__return_storage_ptr__->d).size = local_60.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}